

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O3

wchar_t sftp_cmd_mv(sftp_command *cmd)

{
  _Bool _Var1;
  sftp_request *req;
  sftp_packet *pktin;
  char cVar2;
  wchar_t wVar3;
  char *pcVar4;
  ulong uVar5;
  sftp_context_mv ctx [1];
  fxp_attrs attrs;
  char *local_78;
  char local_70;
  fxp_attrs local_68;
  
  if (backend == (Backend *)0x0) {
    pcVar4 = "psftp: not connected to a host; use \"open host.name\"";
  }
  else {
    if (2 < cmd->nwords) {
      pcVar4 = canonify(cmd->words[cmd->nwords - 1]);
      local_78 = pcVar4;
      req = fxp_stat_send(pcVar4);
      pktin = sftp_wait_for_reply(req);
      _Var1 = fxp_stat_recv(pktin,req,&local_68);
      if (((!_Var1) || (((byte)local_68.flags & 4) == 0)) ||
         (cVar2 = '\x01', (local_68.permissions._1_1_ & 0x40) == 0)) {
        cVar2 = '\0';
      }
      local_70 = cVar2;
      if (((3 < cmd->nwords) || (_Var1 = is_wildcard(cmd->words[1]), _Var1)) && (cVar2 == '\0')) {
        puts("mv: multiple or wildcard arguments require the destination to be a directory");
        safefree(pcVar4);
        return L'\0';
      }
      wVar3 = L'\x01';
      if (cmd->nwords - 3 < 0xfffffffffffffffe) {
        uVar5 = 1;
        do {
          _Var1 = wildcard_iterate(cmd->words[uVar5],sftp_action_mv,&local_78);
          if (!_Var1) {
            wVar3 = L'\0';
          }
          uVar5 = uVar5 + 1;
          pcVar4 = local_78;
        } while (uVar5 < cmd->nwords - 1);
      }
      safefree(pcVar4);
      return wVar3;
    }
    pcVar4 = "mv: expects two filenames";
  }
  puts(pcVar4);
  return L'\0';
}

Assistant:

int sftp_cmd_mv(struct sftp_command *cmd)
{
    struct sftp_context_mv ctx[1];
    int i, ret;

    if (!backend) {
        not_connected();
        return 0;
    }

    if (cmd->nwords < 3) {
        printf("mv: expects two filenames\n");
        return 0;
    }

    ctx->dstfname = canonify(cmd->words[cmd->nwords-1]);

    /*
     * If there's more than one source argument, or one source
     * argument which is a wildcard, we _require_ that the
     * destination is a directory.
     */
    ctx->dest_is_dir = check_is_dir(ctx->dstfname);
    if ((cmd->nwords > 3 || is_wildcard(cmd->words[1])) && !ctx->dest_is_dir) {
        printf("mv: multiple or wildcard arguments require the destination"
               " to be a directory\n");
        sfree(ctx->dstfname);
        return 0;
    }

    /*
     * Now iterate over the source arguments.
     */
    ret = 1;
    for (i = 1; i < cmd->nwords-1; i++)
        ret &= wildcard_iterate(cmd->words[i], sftp_action_mv, ctx);

    sfree(ctx->dstfname);
    return ret;
}